

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O0

void __thiscall Downloader::Uninstall(Downloader *this,string *package)

{
  string *__return_storage_ptr__;
  bool bVar1;
  ostream *poVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  CCDir local_410;
  uchar local_32a;
  uchar local_329;
  string local_328;
  CCDir local_308;
  undefined1 local_228 [8];
  PackageList packagelist;
  undefined1 local_1d8 [8];
  DownloadPackage inpack;
  string local_138;
  undefined1 local_118 [8];
  CCDir ccdir;
  string compiler;
  string *package_local;
  Downloader *this_local;
  
  __return_storage_ptr__ = (string *)(ccdir.compiler_name.field_2._M_local_buf + 8);
  get_compiler_abi_cxx11_(__return_storage_ptr__,this,true);
  std::__cxx11::string::string((string *)&local_138,(string *)__return_storage_ptr__);
  MakeCCDir((CCDir *)local_118,this,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string
            ((string *)&packagelist.packages._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)package);
  LibParse((DownloadPackage *)local_1d8,this,
           (string *)&packagelist.packages._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string
            ((string *)&packagelist.packages._M_t._M_impl.super__Rb_tree_header._M_node_count);
  PackageList::PackageList((PackageList *)local_228);
  CCDir::CCDir(&local_308,(CCDir *)local_118);
  PackageList::read((PackageList *)local_228,(int)&local_308,__buf,in_RCX);
  CCDir::~CCDir(&local_308);
  std::__cxx11::string::string((string *)&local_328,(string *)local_1d8);
  bVar1 = PackageList::erase((PackageList *)local_228,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Successfully uninstalled ");
    poVar2 = std::operator<<(poVar2,(string *)local_1d8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_329 = ispring::xout[0x36];
    poVar2 = operator<<((ostream *)&std::cout,ispring::xout[0x36]);
    poVar2 = std::operator<<(poVar2,"WARNING: Skipping ");
    poVar2 = std::operator<<(poVar2,(string *)local_1d8);
    poVar2 = std::operator<<(poVar2," as it is not installed.");
    local_32a = ispring::xout[0x37];
    poVar2 = operator<<(poVar2,ispring::xout[0x37]);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  CCDir::CCDir(&local_410,(CCDir *)local_118);
  PackageList::write((PackageList *)local_228,(int)&local_410,__buf_00,in_RCX);
  CCDir::~CCDir(&local_410);
  PackageList::~PackageList((PackageList *)local_228);
  DownloadPackage::~DownloadPackage((DownloadPackage *)local_1d8);
  CCDir::~CCDir((CCDir *)local_118);
  std::__cxx11::string::~string((string *)(ccdir.compiler_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Uninstall(std::string package){
        std::string compiler=get_compiler();
        CCDir ccdir=MakeCCDir(compiler);
        DownloadPackage inpack=LibParse(package);
        PackageList packagelist;
        packagelist.read(ccdir);
        if(packagelist.erase(inpack.libname)){
            std::cout << "Successfully uninstalled " << inpack.libname << std::endl;
        }else{
            std::cout << ispring::xout.yellow << "WARNING: Skipping " << inpack.libname << " as it is not installed." << ispring::xout.white << std::endl;
        }
        packagelist.write(ccdir);
    }